

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByXpan
          (Registry *this,uint64_t aXpan,Network *aRet)

{
  Status SVar1;
  Network nwk;
  Network local_80;
  
  Network::Network(&local_80);
  local_80.mXpan = aXpan;
  SVar1 = LookupOne(this,&local_80,aRet);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mMlp._M_dataplus._M_p != &local_80.mMlp.field_2) {
    operator_delete(local_80.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.mName._M_dataplus._M_p != &local_80.mName.field_2) {
    operator_delete(local_80.mName._M_dataplus._M_p);
  }
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkByXpan(uint64_t aXpan, Network &aRet)
{
    Network nwk{};
    nwk.mXpan = aXpan;
    return LookupOne(nwk, aRet);
}